

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O1

void Abc_NtkInOutSupportCounters
               (Abc_Ntk_t *pNtk,Vec_Int_t *vFan,Vec_Int_t *vFon,Vec_Int_t *vFanR,Vec_Int_t *vFonR)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  void *pvVar8;
  Vec_Int_t *__ptr;
  Vec_Int_t *__ptr_00;
  int *piVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  
  __ptr = Abc_NtkCollectCoSupps(pNtk,1);
  __ptr_00 = Abc_NtkCollectCiSupps(pNtk,1);
  uVar3 = __ptr->nSize;
  uVar12 = (ulong)uVar3;
  iVar11 = 0;
  iVar14 = 0;
  if (uVar12 != 0) {
    iVar14 = *__ptr->pArray;
    if (1 < (int)uVar3) {
      uVar10 = 1;
      do {
        iVar4 = __ptr->pArray[uVar10];
        if (iVar14 <= iVar4) {
          iVar14 = iVar4;
        }
        uVar10 = uVar10 + 1;
      } while (uVar12 != uVar10);
    }
  }
  uVar5 = __ptr_00->nSize;
  if ((ulong)uVar5 != 0) {
    iVar11 = *__ptr_00->pArray;
    if (1 < (int)uVar5) {
      uVar10 = 1;
      do {
        iVar4 = __ptr_00->pArray[uVar10];
        if (iVar11 <= iVar4) {
          iVar11 = iVar4;
        }
        uVar10 = uVar10 + 1;
      } while (uVar5 != uVar10);
    }
  }
  uVar1 = iVar14 + 1;
  if (vFan->nCap <= iVar14) {
    if (vFan->pArray == (int *)0x0) {
      piVar9 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar9 = (int *)realloc(vFan->pArray,(long)(int)uVar1 << 2);
    }
    vFan->pArray = piVar9;
    if (piVar9 == (int *)0x0) goto LAB_002ef576;
    vFan->nCap = uVar1;
  }
  if (-1 < iVar14) {
    memset(vFan->pArray,0,(ulong)uVar1 * 4);
  }
  vFan->nSize = uVar1;
  uVar2 = iVar11 + 1;
  if (vFon->nCap <= iVar11) {
    if (vFon->pArray == (int *)0x0) {
      piVar9 = (int *)malloc((long)(int)uVar2 << 2);
    }
    else {
      piVar9 = (int *)realloc(vFon->pArray,(long)(int)uVar2 << 2);
    }
    vFon->pArray = piVar9;
    if (piVar9 == (int *)0x0) goto LAB_002ef576;
    vFon->nCap = uVar2;
  }
  if (-1 < iVar11) {
    memset(vFon->pArray,0,(ulong)uVar2 * 4);
  }
  vFon->nSize = uVar2;
  if (vFanR->nCap <= iVar14) {
    if (vFanR->pArray == (int *)0x0) {
      piVar9 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar9 = (int *)realloc(vFanR->pArray,(long)(int)uVar1 << 2);
    }
    vFanR->pArray = piVar9;
    if (piVar9 == (int *)0x0) goto LAB_002ef576;
    vFanR->nCap = uVar1;
  }
  if (-1 < iVar14) {
    memset(vFanR->pArray,0,(ulong)uVar1 << 2);
  }
  vFanR->nSize = uVar1;
  if (vFonR->nCap <= iVar11) {
    if (vFonR->pArray == (int *)0x0) {
      piVar9 = (int *)malloc((long)(int)uVar2 << 2);
    }
    else {
      piVar9 = (int *)realloc(vFonR->pArray,(long)(int)uVar2 << 2);
    }
    vFonR->pArray = piVar9;
    if (piVar9 == (int *)0x0) {
LAB_002ef576:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vFonR->nCap = uVar2;
  }
  if (-1 < iVar11) {
    memset(vFonR->pArray,0,(ulong)uVar2 << 2);
  }
  vFonR->nSize = uVar2;
  pVVar6 = pNtk->vCos;
  if (0 < pVVar6->nSize) {
    ppvVar7 = pVVar6->pArray;
    uVar10 = 0;
    if ((int)uVar3 < 1) {
      uVar12 = uVar10;
    }
    do {
      if (uVar12 == uVar10) goto LAB_002ef538;
      iVar14 = __ptr->pArray[uVar10];
      lVar13 = (long)iVar14;
      if ((lVar13 < 0) || (vFan->nSize <= iVar14)) goto LAB_002ef519;
      pvVar8 = ppvVar7[uVar10];
      vFan->pArray[lVar13] = vFan->pArray[lVar13] + 1;
      if (vFanR->nSize <= iVar14) goto LAB_002ef557;
      vFanR->pArray[lVar13] = *(int *)((long)pvVar8 + 0x10);
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)pVVar6->nSize);
  }
  pVVar6 = pNtk->vCis;
  if (0 < pVVar6->nSize) {
    ppvVar7 = pVVar6->pArray;
    uVar10 = 0;
    uVar12 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar12 = uVar10;
    }
    do {
      if (uVar12 == uVar10) {
LAB_002ef538:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar14 = __ptr_00->pArray[uVar10];
      lVar13 = (long)iVar14;
      if ((lVar13 < 0) || (vFon->nSize <= iVar14)) {
LAB_002ef519:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      pvVar8 = ppvVar7[uVar10];
      vFon->pArray[lVar13] = vFon->pArray[lVar13] + 1;
      if (vFonR->nSize <= iVar14) {
LAB_002ef557:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      vFonR->pArray[lVar13] = *(int *)((long)pvVar8 + 0x10);
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)pVVar6->nSize);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  if (__ptr_00->pArray != (int *)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (int *)0x0;
  }
  if (__ptr_00 != (Vec_Int_t *)0x0) {
    free(__ptr_00);
    return;
  }
  return;
}

Assistant:

void Abc_NtkInOutSupportCounters( Abc_Ntk_t * pNtk, Vec_Int_t * vFan, Vec_Int_t * vFon, Vec_Int_t * vFanR, Vec_Int_t * vFonR )
{
    Abc_Obj_t * pNode;
    Vec_Int_t * vSuppsCo = Abc_NtkCollectCoSupps( pNtk, 1 );
    Vec_Int_t * vSuppsCi = Abc_NtkCollectCiSupps( pNtk, 1 );
    int i, nFanins, nFanouts;
    int nFaninsMax  = Vec_IntFindMax( vSuppsCo );
    int nFanoutsMax = Vec_IntFindMax( vSuppsCi );
    Vec_IntFill( vFan, nFaninsMax + 1, 0 );
    Vec_IntFill( vFon, nFanoutsMax + 1, 0 );
    Vec_IntFill( vFanR, nFaninsMax + 1, 0 );
    Vec_IntFill( vFonR, nFanoutsMax + 1, 0 );
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        nFanins  = Vec_IntEntry( vSuppsCo, i );
        Vec_IntAddToEntry( vFan,  nFanins, 1 );
        Vec_IntWriteEntry( vFanR, nFanins, Abc_ObjId(pNode) );
    }
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        nFanouts = Vec_IntEntry( vSuppsCi, i );
        Vec_IntAddToEntry( vFon, nFanouts, 1 );
        Vec_IntWriteEntry( vFonR, nFanouts, Abc_ObjId(pNode) );
    }
    Vec_IntFree( vSuppsCo );
    Vec_IntFree( vSuppsCi );
}